

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::DiscoverSyntheticTargets
          (cmGeneratorTarget *this,cmSyntheticTargetCache *cache,string *config)

{
  cmTarget *tgt_00;
  cmMakefile *this_00;
  string_view sVar1;
  cmFileSet *b;
  pointer this_01;
  bool bVar2;
  cmFileSetVisibility vis;
  mapped_type *pmVar3;
  reference pcVar4;
  cmLocalGenerator *pcVar5;
  string *psVar6;
  string *type;
  pointer pcVar7;
  mapped_type *ppcVar8;
  pointer ppVar9;
  mapped_type *this_02;
  pair<cmFileSet_*,_bool> pVar10;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_2f8;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_2f0;
  __single_object gtp;
  cmFileSet *newFs;
  string local_2b8;
  cmFileSet *local_298;
  cmFileSet *fs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fsName;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fsNames;
  cmTarget *tgt;
  cmLocalGenerator *lg;
  cmMakefile *mf;
  cmTarget *model;
  value_type local_230;
  cmGeneratorTarget *synthDep;
  iterator cached;
  undefined1 local_200 [8];
  string targetName;
  undefined1 local_1b0 [8];
  string targetIdent;
  string safeName;
  undefined1 local_160 [8];
  string dirhash;
  size_t HASH_TRUNCATION;
  cmCryptoHash hasher;
  cmGeneratorTarget *gt;
  cmLinkImplItem *entry;
  iterator __end1;
  iterator __begin1;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range1;
  map<const_cmGeneratorTarget_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  *SyntheticDeps;
  cmCxxModuleUsageEffects usage;
  undefined1 local_c8 [8];
  cmOptionalLinkImplementation impl;
  string *config_local;
  cmSyntheticTargetCache *cache_local;
  cmGeneratorTarget *this_local;
  
  impl.super_cmLinkImplementation._160_8_ = config;
  cmOptionalLinkImplementation::cmOptionalLinkImplementation
            ((cmOptionalLinkImplementation *)local_c8);
  ComputeLinkImplementationLibraries
            (this,(string *)impl.super_cmLinkImplementation._160_8_,
             (cmOptionalLinkImplementation *)local_c8,this,Link);
  cmCxxModuleUsageEffects::cmCxxModuleUsageEffects((cmCxxModuleUsageEffects *)&SyntheticDeps,this);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::InfoByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::InfoByConfig>_>_>
           ::operator[](&this->Configs,(key_type *)impl.super_cmLinkImplementation._160_8_);
  __end1 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                     ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_c8);
  entry = (cmLinkImplItem *)
          std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                    ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_c8);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                     *)&entry), bVar2) {
    pcVar4 = __gnu_cxx::
             __normal_iterator<cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
             ::operator*(&__end1);
    hasher.CTX = (rhash_context *)(pcVar4->super_cmLinkItem).Target;
    if ((((cmGeneratorTarget *)hasher.CTX != (cmGeneratorTarget *)0x0) &&
        (bVar2 = IsImported((cmGeneratorTarget *)hasher.CTX), bVar2)) &&
       (bVar2 = HaveCxx20ModuleSources((cmGeneratorTarget *)hasher.CTX,(string *)0x0), bVar2)) {
      cmCryptoHash::cmCryptoHash((cmCryptoHash *)&HASH_TRUNCATION,AlgoSHA3_512);
      dirhash.field_2._8_8_ = 0xc;
      pcVar5 = GetLocalGenerator((cmGeneratorTarget *)hasher.CTX);
      psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar5);
      sVar1 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
      cmCryptoHash::HashString_abi_cxx11_
                ((string *)local_160,(cmCryptoHash *)&HASH_TRUNCATION,sVar1);
      psVar6 = GetName_abi_cxx11_((cmGeneratorTarget *)hasher.CTX);
      std::__cxx11::string::string
                ((string *)(targetIdent.field_2._M_local_buf + 8),(string *)psVar6);
      cmsys::SystemTools::ReplaceString((string *)((long)&targetIdent.field_2 + 8),":","_");
      psVar6 = cmCxxModuleUsageEffects::GetHash_abi_cxx11_
                         ((cmCxxModuleUsageEffects *)&SyntheticDeps);
      cmStrCat<char_const(&)[4],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string_const&>
                ((string *)((long)&targetName.field_2 + 8),(char (*) [4])"@d_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 (char (*) [4])"@u_",psVar6);
      sVar1 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(targetName.field_2._M_local_buf + 8));
      cmCryptoHash::HashString_abi_cxx11_
                ((string *)local_1b0,(cmCryptoHash *)&HASH_TRUNCATION,sVar1);
      std::__cxx11::string::~string((string *)(targetName.field_2._M_local_buf + 8));
      std::__cxx11::string::substr((ulong)&cached,(ulong)local_1b0);
      cmStrCat<std::__cxx11::string&,char_const(&)[8],std::__cxx11::string>
                ((string *)local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&targetIdent.field_2 + 8),(char (*) [8])"@synth_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cached);
      std::__cxx11::string::~string((string *)&cached);
      synthDep = (cmGeneratorTarget *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                 ::find(&cache->CxxModuleTargets,(key_type *)local_200);
      local_230 = (value_type)0x0;
      model = (cmTarget *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
              ::end(&cache->CxxModuleTargets);
      bVar2 = std::operator==((_Self *)&synthDep,(_Self *)&model);
      if (bVar2) {
        tgt_00 = (cmTarget *)(hasher.CTX)->msg_size;
        this_00 = *(cmMakefile **)&(hasher.CTX)->hash_id;
        pcVar5 = GetLocalGenerator((cmGeneratorTarget *)hasher.CTX);
        fsNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)cmMakefile::AddSynthesizedTarget
                                (this_00,INTERFACE_LIBRARY,(string *)local_200);
        cmTarget::CopyPolicyStatuses
                  ((cmTarget *)
                   fsNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,tgt_00);
        cmTarget::GetAllFileSetNames_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range4,tgt_00);
        __end4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range4);
        fsName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range4);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&fsName), bVar2) {
          fs = (cmFileSet *)
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end4);
          local_298 = cmTarget::GetFileSet(tgt_00,(string *)fs);
          this_01 = fsNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          b = fs;
          if (local_298 == (cmFileSet *)0x0) {
            psVar6 = cmTarget::GetName_abi_cxx11_
                               ((cmTarget *)
                                fsNames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            newFs._7_1_ = 0x27;
            cmStrCat<char_const(&)[32],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string_const&,char>
                      (&local_2b8,(char (*) [32])"Failed to find file set named \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b,
                       (char (*) [14])"\' on target \'",psVar6,(char *)((long)&newFs + 7));
            cmMakefile::IssueMessage(this_00,INTERNAL_ERROR,&local_2b8);
            std::__cxx11::string::~string((string *)&local_2b8);
          }
          else {
            psVar6 = cmFileSet::GetName_abi_cxx11_(local_298);
            type = cmFileSet::GetType_abi_cxx11_(local_298);
            vis = cmFileSet::GetVisibility(local_298);
            pVar10 = cmTarget::GetOrCreateFileSet((cmTarget *)this_01,psVar6,type,vis);
            gtp._M_t.
            super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t.
            super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
            super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                 (__uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true>
                  )pVar10.first;
            cmFileSet::CopyEntries
                      ((cmFileSet *)
                       gtp._M_t.
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,local_298);
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end4);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range4);
        cmTarget::CopyImportedCxxModulesEntries
                  ((cmTarget *)
                   fsNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,tgt_00);
        cmTarget::CopyImportedCxxModulesProperties
                  ((cmTarget *)
                   fsNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,tgt_00);
        cmCxxModuleUsageEffects::ApplyToTarget
                  ((cmCxxModuleUsageEffects *)&SyntheticDeps,
                   (cmTarget *)
                   fsNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>
                  ((cmTarget **)&local_2f0,
                   (cmLocalGenerator **)
                   &fsNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pcVar7 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                           (&local_2f0);
        local_230 = pcVar7;
        ppcVar8 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                  ::operator[](&cache->CxxModuleTargets,(key_type *)local_200);
        *ppcVar8 = pcVar7;
        pcVar7 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->(&local_2f0);
        DiscoverSyntheticTargets(pcVar7,cache,(string *)impl.super_cmLinkImplementation._160_8_);
        std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::unique_ptr
                  (&local_2f8,&local_2f0);
        cmLocalGenerator::AddGeneratorTarget(pcVar5,&local_2f8);
        std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                  (&local_2f8);
        std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                  (&local_2f0);
      }
      else {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>
                               *)&synthDep);
        local_230 = ppVar9->second;
      }
      this_02 = std::
                map<const_cmGeneratorTarget_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                ::operator[](&pmVar3->SyntheticDeps,(key_type *)&hasher.CTX);
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
                (this_02,&local_230);
      std::__cxx11::string::~string((string *)local_200);
      std::__cxx11::string::~string((string *)local_1b0);
      std::__cxx11::string::~string((string *)(targetIdent.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_160);
      cmCryptoHash::~cmCryptoHash((cmCryptoHash *)&HASH_TRUNCATION);
    }
    __gnu_cxx::
    __normal_iterator<cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
    ::operator++(&__end1);
  }
  cmCxxModuleUsageEffects::~cmCxxModuleUsageEffects((cmCxxModuleUsageEffects *)&SyntheticDeps);
  cmOptionalLinkImplementation::~cmOptionalLinkImplementation
            ((cmOptionalLinkImplementation *)local_c8);
  return true;
}

Assistant:

bool cmGeneratorTarget::DiscoverSyntheticTargets(cmSyntheticTargetCache& cache,
                                                 std::string const& config)
{
  cmOptionalLinkImplementation impl;
  this->ComputeLinkImplementationLibraries(config, impl, this,
                                           LinkInterfaceFor::Link);

  cmCxxModuleUsageEffects usage(this);

  auto& SyntheticDeps = this->Configs[config].SyntheticDeps;

  for (auto const& entry : impl.Libraries) {
    auto const* gt = entry.Target;
    if (!gt || !gt->IsImported()) {
      continue;
    }

    if (gt->HaveCxx20ModuleSources()) {
      cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_512);
      constexpr size_t HASH_TRUNCATION = 12;
      auto dirhash = hasher.HashString(
        gt->GetLocalGenerator()->GetCurrentBinaryDirectory());
      std::string safeName = gt->GetName();
      cmSystemTools::ReplaceString(safeName, ":", "_");
      auto targetIdent =
        hasher.HashString(cmStrCat("@d_", dirhash, "@u_", usage.GetHash()));
      std::string targetName =
        cmStrCat(safeName, "@synth_", targetIdent.substr(0, HASH_TRUNCATION));

      // Check the cache to see if this instance of the imported target has
      // already been created.
      auto cached = cache.CxxModuleTargets.find(targetName);
      cmGeneratorTarget const* synthDep = nullptr;
      if (cached == cache.CxxModuleTargets.end()) {
        auto const* model = gt->Target;
        auto* mf = gt->Makefile;
        auto* lg = gt->GetLocalGenerator();
        auto* tgt = mf->AddSynthesizedTarget(cmStateEnums::INTERFACE_LIBRARY,
                                             targetName);

        // Copy relevant information from the existing IMPORTED target.

        // Copy policies to the target.
        tgt->CopyPolicyStatuses(model);

        // Copy file sets.
        {
          auto fsNames = model->GetAllFileSetNames();
          for (auto const& fsName : fsNames) {
            auto const* fs = model->GetFileSet(fsName);
            if (!fs) {
              mf->IssueMessage(MessageType::INTERNAL_ERROR,
                               cmStrCat("Failed to find file set named '",
                                        fsName, "' on target '",
                                        tgt->GetName(), '\''));
              continue;
            }
            auto* newFs = tgt
                            ->GetOrCreateFileSet(fs->GetName(), fs->GetType(),
                                                 fs->GetVisibility())
                            .first;
            newFs->CopyEntries(fs);
          }
        }

        // Copy imported C++ module properties.
        tgt->CopyImportedCxxModulesEntries(model);

        // Copy other properties which may affect the C++ module BMI
        // generation.
        tgt->CopyImportedCxxModulesProperties(model);

        // Apply usage requirements to the target.
        usage.ApplyToTarget(tgt);

        // Create the generator target and attach it to the local generator.
        auto gtp = cm::make_unique<cmGeneratorTarget>(tgt, lg);
        synthDep = gtp.get();
        cache.CxxModuleTargets[targetName] = synthDep;
        gtp->DiscoverSyntheticTargets(cache, config);
        lg->AddGeneratorTarget(std::move(gtp));
      } else {
        synthDep = cached->second;
      }

      SyntheticDeps[gt].push_back(synthDep);
    }
  }

  return true;
}